

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# box.cpp
# Opt level: O0

void __thiscall tli_window_manager::FrameBox::print(FrameBox *this,Canvas *canvas,int row,int col)

{
  reference pvVar1;
  reference pvVar2;
  int local_28;
  int local_24;
  int j;
  int i;
  int col_local;
  int row_local;
  Canvas *canvas_local;
  FrameBox *this_local;
  
  pvVar1 = std::
           vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
           ::operator[](canvas,(long)row);
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](pvVar1,(long)col);
  *pvVar2 = '+';
  pvVar1 = std::
           vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
           ::operator[](canvas,(long)(row + (this->super_Box).height_ + -1));
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](pvVar1,(long)col);
  *pvVar2 = '+';
  pvVar1 = std::
           vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
           ::operator[](canvas,(long)(row + (this->super_Box).height_ + -1));
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                     (pvVar1,(long)(col + (this->super_Box).width_ + -1));
  *pvVar2 = '+';
  pvVar1 = std::
           vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
           ::operator[](canvas,(long)row);
  pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                     (pvVar1,(long)(col + (this->super_Box).width_ + -1));
  *pvVar2 = '+';
  for (local_24 = 1; local_24 < (this->super_Box).width_ + -1; local_24 = local_24 + 1) {
    pvVar1 = std::
             vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ::operator[](canvas,(long)row);
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](pvVar1,(long)(col + local_24));
    *pvVar2 = '-';
    pvVar1 = std::
             vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ::operator[](canvas,(long)(row + (this->super_Box).height_ + -1));
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](pvVar1,(long)(col + local_24));
    *pvVar2 = '-';
  }
  for (local_28 = 1; local_28 < (this->super_Box).height_ + -1; local_28 = local_28 + 1) {
    pvVar1 = std::
             vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ::operator[](canvas,(long)(row + local_28));
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[](pvVar1,(long)col);
    *pvVar2 = '|';
    pvVar1 = std::
             vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
             ::operator[](canvas,(long)(row + local_28));
    pvVar2 = std::vector<char,_std::allocator<char>_>::operator[]
                       (pvVar1,(long)(col + (this->super_Box).width_ + -1));
    *pvVar2 = '|';
  }
  (*this->box_->_vptr_Box[1])(this->box_,canvas,(ulong)(row + 1),(ulong)(col + 1));
  return;
}

Assistant:

void FrameBox::print(Canvas &canvas, int row, int col) const {
    canvas[row][col] = '+';
    canvas[row + height_ - 1][col] = '+';
    canvas[row + height_ - 1][col + width_ - 1] = '+';
    canvas[row][col + width_ - 1] = '+';
    for (int i = 1; i < width_ - 1; ++i) {
        canvas[row][col + i] = '-';
        canvas[row + height_ - 1][col + i] = '-';
    }
    for (int j = 1; j < height_ - 1; ++j) {
        canvas[row + j][col] = '|';
        canvas[row + j][col + width_ - 1] = '|';
    }
    box_->print(canvas, row + 1, col + 1);
}